

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O1

int __thiscall
baryonyx::itm::
solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
::select_variables(solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
                   *this,int r_size,int bkmin,int bkmax)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int unaff_R12D;
  long lVar5;
  bool bVar6;
  bool bVar7;
  double dVar8;
  
  iVar4 = bkmin;
  if (r_size < bkmin) {
    iVar4 = r_size;
  }
  if (bkmin == bkmax) {
    iVar4 = iVar4 + -1;
  }
  else {
    iVar2 = bkmax;
    if (r_size < bkmax) {
      iVar2 = r_size;
    }
    bVar1 = bkmax < iVar4;
    if (iVar4 <= bkmax) {
      if (bkmin < r_size) {
        r_size = bkmin;
      }
      if (iVar4 < iVar2) {
        iVar4 = iVar2;
      }
      unaff_R12D = r_size + -1;
      lVar3 = (long)r_size << 4;
      lVar5 = (long)r_size;
      do {
        dVar8 = *(double *)
                 ((long)&((this->R)._M_t.
                          super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
                          .
                          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
                         ._M_head_impl)->value + lVar3);
        bVar7 = dVar8 == 0.0;
        bVar6 = dVar8 < 0.0;
        if ((bVar7) && (!NAN(dVar8))) {
          dVar8 = std::
                  generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                            (this->rng);
          bVar7 = dVar8 == 0.5;
          bVar6 = 0.5 < dVar8;
        }
        if (!bVar6 && !bVar7) break;
        bVar1 = iVar2 <= lVar5;
        unaff_R12D = unaff_R12D + 1;
        lVar3 = lVar3 + 0x10;
        lVar5 = lVar5 + 1;
      } while (iVar4 != unaff_R12D);
    }
    iVar4 = iVar2 + -1;
    if (!bVar1) {
      iVar4 = unaff_R12D;
    }
  }
  return iVar4;
}

Assistant:

int select_variables(const int r_size, int bkmin, int bkmax)
    {
        if (bkmin == bkmax)
            return std::min(bkmin, r_size) - 1;

        bkmin = std::min(bkmin, r_size);
        bkmax = std::min(bkmax, r_size);

        for (int i = bkmin; i <= bkmax; ++i)
            if (stop_iterating<Mode>(R[i].value, rng))
                return i - 1;

        return bkmax - 1;
    }